

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_draw_triangle(rf_vec2 v1,rf_vec2 v2,rf_vec2 v3,rf_color color)

{
  _Bool _Var1;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_38;
  undefined4 uStack_34;
  
  _Var1 = rf_gfx_check_buffer_limit(4);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  local_58 = v1.x;
  uStack_54 = v1.y;
  rf_gfx_vertex2f(local_58,uStack_54);
  local_48 = v2.x;
  uStack_44 = v2.y;
  rf_gfx_vertex2f(local_48,uStack_44);
  local_38 = v3.x;
  uStack_34 = v3.y;
  rf_gfx_vertex2f(local_38,uStack_34);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_triangle(rf_vec2 v1, rf_vec2 v2, rf_vec2 v3, rf_color color)
{
    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();
    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(v1.x, v1.y);
    rf_gfx_vertex2f(v2.x, v2.y);
    rf_gfx_vertex2f(v3.x, v3.y);
    rf_gfx_end();

}